

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  ulong uVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar2;
  double logMax;
  int i_1;
  int offset_1;
  int l_1;
  double oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  double max;
  int k;
  bool useLogScalars;
  int local_5c;
  int local_58;
  int local_54;
  int local_48;
  int local_44;
  int local_40;
  double local_38;
  int local_2c;
  
  uVar1 = *(ulong *)(in_RDI + 0x58);
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x14); local_2c = local_2c + 1) {
    local_38 = 0.0;
    for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x34); local_40 = local_40 + 1) {
      local_44 = local_40 * *(int *)(in_RDI + 0x18) * 4 + local_2c * 4;
      for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
        if (local_38 < *(double *)(in_RSI + (long)local_44 * 8)) {
          local_38 = *(double *)(in_RSI + (long)local_44 * 8);
        }
        local_44 = local_44 + 1;
      }
    }
    if ((local_38 == 0.0) && (!NAN(local_38))) {
      local_38 = 1.0;
    }
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x34); local_54 = local_54 + 1) {
      local_58 = local_54 * *(int *)(in_RDI + 0x18) * 4 + local_2c * 4;
      for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
        *(double *)(in_RSI + (long)local_58 * 8) =
             (1.0 / local_38) * *(double *)(in_RSI + (long)local_58 * 8);
        local_58 = local_58 + 1;
      }
    }
    if ((uVar1 & 0x400) == 0) {
      *(double *)(in_RDX + (long)local_2c * 8) = local_38;
      if (in_RCX != 0) {
        dVar2 = log(local_38);
        *(double *)(in_RCX + (long)local_2c * 8) = dVar2 + *(double *)(in_RCX + (long)local_2c * 8);
      }
    }
    else {
      dVar2 = log(local_38);
      *(double *)(in_RDX + (long)local_2c * 8) = dVar2;
      if (in_RCX != 0) {
        *(double *)(in_RCX + (long)local_2c * 8) = dVar2 + *(double *)(in_RCX + (long)local_2c * 8);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}